

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O1

void __thiscall chrono::ChBezierCurve::ArchiveIN(ChBezierCurve *this,ChArchiveIn *marchive)

{
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_38;
  
  ChArchiveIn::VersionRead<chrono::ChBezierCurve>(marchive);
  local_38._name = "m_points";
  local_38._flags = '\0';
  local_38._value = &this->m_points;
  ChArchiveIn::in<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_inCV;
  local_38._name = "m_inCV";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_outCV;
  local_38._name = "m_outCV";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChVector<double>>(marchive,&local_38);
  local_38._name = "m_maxNumIters";
  local_38._value =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
       &m_maxNumIters;
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x48))(marchive,&local_38);
  local_38._name = "m_sqrDistTol";
  local_38._value =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)&m_sqrDistTol
  ;
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._name = "m_cosAngleTol";
  local_38._value =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
       &m_cosAngleTol;
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._name = "m_paramTol";
  local_38._value =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)&m_paramTol;
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChBezierCurve::ArchiveIN(ChArchiveIn& marchive)
{
    // version number
    /*int version =*/ marchive.VersionRead<ChBezierCurve>();

    // stream in all member data:
    marchive >> CHNVP(m_points);
    marchive >> CHNVP(m_inCV);
    marchive >> CHNVP(m_outCV);
    marchive >> CHNVP(m_maxNumIters);
    marchive >> CHNVP(m_sqrDistTol);
    marchive >> CHNVP(m_cosAngleTol);
    marchive >> CHNVP(m_paramTol);
}